

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O1

u_char * pcap_next(pcap_t *p,pcap_pkthdr *h)

{
  int iVar1;
  u_char *pkt;
  oneshot_userdata s;
  u_char *local_20;
  pcap_pkthdr *local_18;
  u_char **local_10;
  pcap_t *local_8;
  
  local_10 = &local_20;
  local_18 = h;
  local_8 = p;
  iVar1 = (*p->read_op)(p,1,p->oneshot_callback,(u_char *)&local_18);
  if (iVar1 < 1) {
    local_20 = (u_char *)0x0;
  }
  return local_20;
}

Assistant:

const u_char *
pcap_next(pcap_t *p, struct pcap_pkthdr *h)
{
	struct oneshot_userdata s;
	const u_char *pkt;

	s.hdr = h;
	s.pkt = &pkt;
	s.pd = p;
	if (pcap_dispatch(p, 1, p->oneshot_callback, (u_char *)&s) <= 0)
		return (0);
	return (pkt);
}